

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsPixmapItemPrivate::updateShape(QGraphicsPixmapItemPrivate *this)

{
  ShapeMode SVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  double local_60;
  QPoint local_50;
  QPoint local_48;
  QRegion local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPainterPath::QPainterPath((QPainterPath *)&local_78);
  puVar2 = *(undefined1 **)&this->shape;
  *(undefined1 **)&this->shape = local_78;
  local_78 = puVar2;
  QPainterPath::~QPainterPath((QPainterPath *)&local_78);
  SVar1 = this->shapeMode;
  if (SVar1 == HeuristicMaskShape) {
    QPixmap::createHeuristicMask(SUB81(&local_78,0));
LAB_00582a3c:
    QRegion::QRegion((QRegion *)&local_48,(QBitmap *)&local_78);
    local_50 = QPointF::toPoint(&this->offset);
    QRegion::translated(&local_40,&local_48);
    qt_regionToPath((QRegion *)&local_38);
    uVar3 = *(undefined8 *)&this->shape;
    *(undefined8 *)&this->shape = local_38;
    local_38 = uVar3;
    QPainterPath::~QPainterPath((QPainterPath *)&local_38);
    QRegion::~QRegion(&local_40);
    QRegion::~QRegion((QRegion *)&local_48);
    QBitmap::~QBitmap((QBitmap *)&local_78);
  }
  else {
    if (SVar1 != BoundingRectShape) {
      if (SVar1 != MaskShape) goto LAB_00582ab1;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::mask();
      cVar5 = QPixmap::isNull();
      if (cVar5 == '\0') goto LAB_00582a3c;
      QBitmap::~QBitmap((QBitmap *)&local_78);
    }
    puVar2 = (undefined1 *)(this->offset).xp;
    puVar4 = (undefined1 *)(this->offset).yp;
    iVar6 = QPixmap::width();
    iVar7 = QPixmap::height();
    local_60 = (double)iVar7;
    local_78 = puVar2;
    puStack_70 = puVar4;
    local_68 = (undefined1 *)(double)iVar6;
    QPainterPath::addRect((QRectF *)&this->shape);
  }
LAB_00582ab1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void updateShape()
    {
        shape = QPainterPath();
        switch (shapeMode) {
        case QGraphicsPixmapItem::MaskShape: {
            QBitmap mask = pixmap.mask();
            if (!mask.isNull()) {
                shape = qt_regionToPath(QRegion(mask).translated(offset.toPoint()));
                break;
            }
            Q_FALLTHROUGH();
        }
        case QGraphicsPixmapItem::BoundingRectShape:
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
            break;
        case QGraphicsPixmapItem::HeuristicMaskShape:
#ifndef QT_NO_IMAGE_HEURISTIC_MASK
            shape = qt_regionToPath(QRegion(pixmap.createHeuristicMask()).translated(offset.toPoint()));
#else
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
#endif
            break;
        }
    }